

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_sdallocx(void *ptr,size_t size,int flags)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  
  if (flags == 0) {
    lVar1 = *in_FS_OFFSET;
    if (size < 0x1001) {
      uVar4 = (ulong)duckdb_je_sz_size2index_tab[size + 7 >> 3];
      uVar3 = duckdb_je_sz_index2size_tab[uVar4] + *(long *)(lVar1 + -0x2740);
      if ((uVar3 < *(ulong *)(lVar1 + -0x2738)) &&
         (lVar2 = *(long *)(lVar1 + -0x2728 + uVar4 * 0x18),
         *(short *)(lVar1 + -0x2716 + uVar4 * 0x18) != (short)lVar2)) {
        *(long *)(lVar1 + uVar4 * 0x18 + -0x2728) = lVar2 + -8;
        *(void **)(lVar2 + -8) = ptr;
        *(ulong *)(lVar1 + -0x2740) = uVar3;
        return;
      }
    }
    flags = 0;
  }
  duckdb_je_sdallocx_default(ptr,size,flags);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_sdallocx(void *ptr, size_t size, int flags) {
	LOG("core.sdallocx.entry", "ptr: %p, size: %zu, flags: %d", ptr,
		size, flags);

	je_sdallocx_impl(ptr, size, flags);

	LOG("core.sdallocx.exit", "");
}